

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
          (RepeatedPtrFieldBase *this)

{
  void **ppvVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint extraout_EAX;
  uint uVar5;
  Rep *pRVar6;
  string *psVar7;
  FileDescriptorProto *this_00;
  undefined8 unaff_RBX;
  undefined1 *puVar8;
  uint uVar9;
  FileDescriptorProto *from;
  RepeatedPtrFieldBase *pRVar10;
  Arena *this_01;
  ulong uVar11;
  undefined8 unaff_R12;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  undefined1 auStack_58 [8];
  code *pcStack_50;
  undefined1 auStack_40 [8];
  undefined8 uStack_38;
  undefined1 auStack_30 [8];
  undefined1 auStack_28 [8];
  code *pcStack_20;
  undefined1 local_10 [16];
  
  uVar5 = this->current_size_;
  if ((int)uVar5 < 0) {
    uVar9 = (uint)local_10;
    pRVar10 = (RepeatedPtrFieldBase *)(ulong)uVar5;
    pcStack_20 = 
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
    ;
    Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
              ();
    puVar8 = auStack_30;
    if ((int)uVar9 < 0) {
      uVar9 = (uint)auStack_28;
      uStack_38 = 0x23ad43;
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                ();
    }
    else if ((int)uVar9 < pRVar10->current_size_) {
      uStack_38 = 0x23ad2c;
      element_at(pRVar10,uVar9);
      return;
    }
    this = (RepeatedPtrFieldBase *)(ulong)uVar9;
    uStack_38 = 0x23ad51;
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
              ();
    uVar5 = this->current_size_;
    if ((int)uVar5 < 0) {
      uVar9 = (uint)auStack_40;
      pRVar10 = (RepeatedPtrFieldBase *)(ulong)uVar5;
      pcStack_50 = 
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
      ;
      Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                ();
      if ((int)uVar9 < 0) {
        uVar9 = (uint)auStack_58;
        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                  ();
        uVar5 = extraout_EAX;
      }
      else {
        uVar5 = pRVar10->current_size_;
        if ((int)uVar9 < (int)uVar5) {
          element_at(pRVar10,uVar9);
          return;
        }
      }
      this_01 = (Arena *)(ulong)uVar9;
      from = (FileDescriptorProto *)(ulong)uVar5;
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                ();
      if (this_01 == (Arena *)0x0) {
        this_00 = (FileDescriptorProto *)operator_new(0xe0);
      }
      else {
        this_00 = (FileDescriptorProto *)Arena::Allocate(this_01,0xe0);
      }
      FileDescriptorProto::FileDescriptorProto(this_00,this_01,from);
      return;
    }
    if (uVar5 == 0) {
      return;
    }
  }
  else {
    puVar8 = (undefined1 *)register0x00000020;
    if (uVar5 == 0) {
      return;
    }
  }
  *(undefined8 *)(puVar8 + -8) = unaff_R15;
  *(undefined8 *)(puVar8 + -0x10) = unaff_R14;
  *(undefined8 *)(puVar8 + -0x18) = unaff_R12;
  *(undefined8 *)(puVar8 + -0x20) = unaff_RBX;
  uVar5 = this->current_size_;
  pRVar10 = this;
  if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
    *(undefined8 *)(puVar8 + -0x40) = 0x1c0292;
    pRVar6 = rep(this);
    pRVar10 = (RepeatedPtrFieldBase *)pRVar6->elements;
  }
  if (0 < (int)uVar5) {
    uVar11 = 0;
    do {
      ppvVar1 = &pRVar10->tagged_rep_or_elem_ + uVar11;
      uVar11 = uVar11 + 1;
      pcVar2 = *(code **)(**ppvVar1 + 0x10);
      *(undefined8 *)(puVar8 + -0x40) = 0x1c02ae;
      (*pcVar2)();
    } while (uVar5 != uVar11);
    this->current_size_ = 0;
    return;
  }
  *(undefined8 *)(puVar8 + -0x40) = 0x1c02d7;
  psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                     ((long)(int)uVar5,0,"n > 0");
  uVar3 = *(undefined8 *)psVar7;
  uVar4 = *(undefined8 *)(psVar7 + 8);
  *(undefined8 *)(puVar8 + -0x40) = 0x1c02f7;
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)(puVar8 + -0x30),
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,0x2a8,uVar4,uVar3);
  *(undefined8 *)(puVar8 + -0x40) = 0x1c02ff;
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)(puVar8 + -0x30));
}

Assistant:

void Clear() {
    const int n = current_size_;
    ABSL_DCHECK_GE(n, 0);
    if (n > 0) {
      using H = CommonHandler<TypeHandler>;
      ClearNonEmpty<H>();
    }
  }